

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buchb.h
# Opt level: O2

void __thiscall
GF2::CritPair<137UL,_GF2::MOGrlex<137UL>_>::GetSPoly
          (CritPair<137UL,_GF2::MOGrlex<137UL>_> *this,MP<137UL,_GF2::MOGrlex<137UL>_> *spoly)

{
  size_t i;
  bool bVar1;
  
  MP<137UL,_GF2::MOGrlex<137UL>_>::operator=
            (spoly,(MP<137UL,_GF2::MOGrlex<137UL>_> *)((this->field_1).iter2._M_node + 1));
  i = (this->field_0).var1;
  if (i == 0xffffffffffffffff) {
    MP<137UL,_GF2::MOGrlex<137UL>_>::SPoly
              (spoly,(MP<137UL,_GF2::MOGrlex<137UL>_> *)((this->field_0).iter1._M_node + 1));
    return;
  }
  MP<137UL,_GF2::MOGrlex<137UL>_>::SPoly(spoly,i);
  if ((spoly->super_list<GF2::MM<137UL>,_std::allocator<GF2::MM<137UL>_>_>).
      super__List_base<GF2::MM<137UL>,_std::allocator<GF2::MM<137UL>_>_>._M_impl._M_node._M_size !=
      0) {
    bVar1 = WW<137ul>::operator==
                      ((WW<137ul> *)
                       ((spoly->super_list<GF2::MM<137UL>,_std::allocator<GF2::MM<137UL>_>_>).
                        super__List_base<GF2::MM<137UL>,_std::allocator<GF2::MM<137UL>_>_>._M_impl.
                        _M_node.super__List_node_base._M_next + 1),
                       (WW<137UL> *)((this->field_1).iter2._M_node[1]._M_next + 1));
    if (bVar1) {
      MP<137UL,_GF2::MOGrlex<137UL>_>::SymDiff
                (spoly,(MP<137UL,_GF2::MOGrlex<137UL>_> *)((this->field_1).iter2._M_node + 1));
      return;
    }
  }
  return;
}

Assistant:

void GetSPoly(MP<_n, _O>& spoly) const
	{
		spoly.SetOrder(iter2->GetOrder());
		spoly = *iter2;
		if (var1 == SIZE_MAX)
			// S-многочлен для пары явных многочленов
			spoly.SPoly(*iter1);
		else
		{
			// S(x_i^2-x_i, f) = f x_i mod (x_i^2-x_i)
			spoly.SPoly(var1);
			if (spoly != 0 && spoly.LM() == iter2->LM())
				spoly += *iter2;
		}
	}